

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinplacetext.cpp
# Opt level: O0

void __thiscall
Am_Button_Text_Info::Get_Info
          (Am_Button_Text_Info *this,int *offset_x,int *offset_y,Am_String *string,Am_Style *style,
          Am_Font *font,Am_Value_List *changing_slots)

{
  short sVar1;
  Am_Widget_Look height_00;
  bool bVar2;
  bool bVar3;
  int width_00;
  int initial;
  Am_Value *pAVar4;
  Am_Value *pAVar5;
  char *string_00;
  Am_Style *local_120;
  Am_Font local_98 [8];
  Am_Object local_90;
  int local_88;
  int local_84;
  int text_height;
  int text_width;
  Am_Widget_Look local_6c;
  int local_68;
  Am_Widget_Look look;
  int align;
  int height;
  int width;
  bool active;
  undefined1 local_48 [8];
  Am_Value value;
  Am_Font *font_local;
  Am_Style *style_local;
  Am_String *string_local;
  int *offset_y_local;
  int *offset_x_local;
  Am_Button_Text_Info *this_local;
  
  value.value = (anon_union_8_8_ea4c8939_for_value)font;
  Am_Value::Am_Value((Am_Value *)local_48);
  pAVar4 = Am_Object::Peek(&this->self,0x1ae,0);
  Am_Value::operator=((Am_Value *)local_48,(Am_Value *)pAVar4);
  if (local_48._0_2_ == 0x8008) {
    Am_String::operator=(string,(Am_Value *)local_48);
  }
  else {
    if (local_48._0_2_ == 0xa001) goto LAB_0010a24a;
    Am_Error("String slot of widget should have string or object value");
  }
  sVar1 = (short)this;
  pAVar4 = (Am_Value *)Am_Object::Get(sVar1 + 8,0xcc);
  bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
  pAVar5 = (Am_Value *)Am_Object::Get(sVar1 + 8,0xac);
  Am_Font::operator=((Am_Font *)value.value.wrapper_value,pAVar5);
  pAVar4 = (Am_Value *)Am_Object::Get(sVar1 + 8,0x66);
  width_00 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = (Am_Value *)Am_Object::Get(sVar1 + 8,0x67);
  look.value = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = (Am_Value *)Am_Object::Get(sVar1 + 8,0x97);
  local_68 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = (Am_Value *)Am_Object::Get(sVar1 + 8,0x17f);
  initial = Am_Value::operator_cast_to_int(pAVar4);
  Am_Value::Am_Value((Am_Value *)&text_height,initial);
  Am_Widget_Look::Am_Widget_Look(&local_6c,(Am_Value *)&text_height);
  Am_Value::~Am_Value((Am_Value *)&text_height);
  bVar3 = Am_Widget_Look::operator==(&local_6c,&Am_MOTIF_LOOK);
  if (bVar3) {
    Am_Object::Am_Object(&local_90,(Am_Object *)&this->self);
    height_00 = look;
    string_00 = Am_String::operator_cast_to_char_(string);
    Am_Font::Am_Font(local_98,(Am_Font *)value.value.wrapper_value);
    Am_Motif_Button_Text_Info
              (&local_90,width_00,height_00.value,string_00,local_98,Am_PUSH_BUTTON,0,0,false,
               local_68,0,offset_x,offset_y,&local_84,&local_88);
    Am_Font::~Am_Font(local_98);
    Am_Object::~Am_Object(&local_90);
    if (bVar2) {
      local_120 = (Am_Style *)&Am_Black;
    }
    else {
      local_120 = (Am_Style *)&Am_Motif_Inactive_Stipple;
    }
    Am_Style::operator=(style,local_120);
  }
  Am_Value_List::operator=(changing_slots,&this->slot_list);
LAB_0010a24a:
  Am_Value::~Am_Value((Am_Value *)local_48);
  return;
}

Assistant:

void Get_Info(int &offset_x, int &offset_y, Am_String &string,
                Am_Style &style, Am_Font &font, Am_Value_List &changing_slots) override
  {
    // now find the contents to draw in the button
    Am_Value value;
    // string slot contains a formula which gets the real object based on the
    // value of the COMMAND slot
    value = self.Peek(Am_REAL_STRING_OR_OBJ);
    if (value.type == Am_STRING)
      string = value;
    else if (value.type == Am_OBJECT)
      return;
    else
      Am_Error("String slot of widget should have string or object value");

    bool active = self.Get(Am_ACTIVE);

    font = self.Get(Am_FONT);

    // find out where the string lives inside the button.
    int width = self.Get(Am_WIDTH);
    int height = self.Get(Am_HEIGHT);
    int align = self.Get(Am_H_ALIGN);
    Am_Widget_Look look = (Am_Widget_Look)(int)self.Get(Am_WIDGET_LOOK);

    int text_width, text_height;

    if (look == Am_MOTIF_LOOK) {
      Am_Motif_Button_Text_Info(self, width, height, string, font,
                                Am_PUSH_BUTTON, 0, 0, false, align, 0, offset_x,
                                offset_y, text_width, text_height);
      style = (active ? Am_Black : Am_Motif_Inactive_Stipple);
    }

    changing_slots = slot_list;
  }